

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O0

void CB_ADF::learn_MTR<false>(cb_adf *mydata,multi_learner *base,multi_ex *examples)

{
  float fVar1;
  float fVar2;
  size_t sVar3;
  reference ppeVar4;
  cb_class *pcVar5;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  label *in_RSI;
  multi_ex *in_RDI;
  cb_to_cs_adf *unaff_retaddr;
  uint64_t in_stack_00000008;
  v_array<COST_SENSITIVE::label> *in_stack_00000010;
  label *in_stack_00000018;
  v_array<CB::label> *in_stack_00000020;
  multi_ex *in_stack_00000028;
  multi_learner *in_stack_00000030;
  size_t in_stack_00000040;
  float old_weight;
  uint32_t nf;
  float local_38;
  float local_24;
  
  GEN_CS::gen_cs_example_mtr(unaff_retaddr,in_RDI,in_RSI);
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)&in_RDI[1].
                                               super__Vector_base<example_*,_std::allocator<example_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
  sVar3 = (*ppeVar4)->num_features;
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)&in_RDI[1].
                                               super__Vector_base<example_*,_std::allocator<example_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
  fVar1 = (*ppeVar4)->weight;
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)&in_RDI[1].
                                               super__Vector_base<example_*,_std::allocator<example_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
  pcVar5 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&((*ppeVar4)->l).simple,0);
  fVar2 = pcVar5->probability;
  local_24 = (float)in_RDI[1].super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_38 = (float)(in_RDI->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)&in_RDI[1].
                                               super__Vector_base<example_*,_std::allocator<example_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
  (*ppeVar4)->weight = (1.0 / fVar2) * (local_24 / local_38) * (*ppeVar4)->weight;
  GEN_CS::call_cs_ldf<true>
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
             in_stack_00000010,in_stack_00000008,in_stack_00000040);
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)&in_RDI[1].
                                               super__Vector_base<example_*,_std::allocator<example_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
  (*ppeVar4)->num_features = (ulong)(uint)sVar3;
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                      (in_RDX,(ulong)*(uint *)&in_RDI[1].
                                               super__Vector_base<example_*,_std::allocator<example_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish);
  (*ppeVar4)->weight = fVar1;
  ppeVar4 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
  std::swap<v_array<ACTION_SCORE::action_score>>
            ((v_array<ACTION_SCORE::action_score> *)&((*ppeVar4)->pred).scalars,
             (v_array<ACTION_SCORE::action_score> *)(in_RDI + 9));
  return;
}

Assistant:

void learn_MTR(cb_adf& mydata, multi_learner& base, multi_ex& examples)
{
  // uint32_t action = 0;
  if (predict)  // first get the prediction to return
  {
    gen_cs_example_ips(examples, mydata.cs_labels);
    call_cs_ldf<false>(base, examples, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);
    swap(examples[0]->pred.a_s, mydata.a_s);
  }
  // second train on _one_ action (which requires up to 3 examples).
  // We must go through the cost sensitive classifier layer to get
  // proper feature handling.
  gen_cs_example_mtr(mydata.gen_cs, examples, mydata.cs_labels);
  uint32_t nf = (uint32_t)examples[mydata.gen_cs.mtr_example]->num_features;
  float old_weight = examples[mydata.gen_cs.mtr_example]->weight;
  examples[mydata.gen_cs.mtr_example]->weight *= 1.f / examples[mydata.gen_cs.mtr_example]->l.cb.costs[0].probability *
      ((float)mydata.gen_cs.event_sum / (float)mydata.gen_cs.action_sum);
  GEN_CS::call_cs_ldf<true>(
      base, mydata.gen_cs.mtr_ec_seq, mydata.cb_labels, mydata.cs_labels, mydata.prepped_cs_labels, mydata.offset);
  examples[mydata.gen_cs.mtr_example]->num_features = nf;
  examples[mydata.gen_cs.mtr_example]->weight = old_weight;
  swap(examples[0]->pred.a_s, mydata.a_s);
}